

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

NameSyntax * __thiscall
slang::ast::Compilation::tryParseName(Compilation *this,string_view name,Diagnostics *localDiags)

{
  SourceManager *sourceManager;
  NameSyntax *pNVar1;
  string_view name_00;
  table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  arrays_1;
  Parser parser;
  Preprocessor preprocessor;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  local_768;
  undefined1 local_738 [32];
  Info *local_718;
  size_t sStack_710;
  Preprocessor local_3c0;
  
  sourceManager = slang::syntax::SyntaxTree::getDefaultSourceManager();
  local_738._0_8_ = (BumpAllocator *)0x3f;
  local_738._8_8_ = (Preprocessor *)0x1;
  local_738._24_8_ = (value_type_pointer)0x0;
  local_738._16_8_ =
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_718 = (Info *)0x0;
  sStack_710 = 0;
  parsing::Preprocessor::Preprocessor
            (&local_3c0,sourceManager,&this->super_BumpAllocator,localDiags,(Bag *)local_738,
             (span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>)
             ZEXT816(0));
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)local_738);
  name_00._M_str = "source";
  name_00._M_len = 6;
  parsing::Preprocessor::pushSource(&local_3c0,name,name_00);
  local_768.arrays.groups_size_index = 0x3f;
  local_768.arrays.groups_size_mask = 1;
  local_768.arrays.elements_ = (value_type_pointer)0x0;
  local_768.arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_768.size_ctrl.ml = 0;
  local_768.size_ctrl.size = 0;
  parsing::Parser::Parser((Parser *)local_738,&local_3c0,(Bag *)&local_768);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core(&local_768);
  pNVar1 = parsing::Parser::parseName((Parser *)local_738);
  parsing::Parser::~Parser((Parser *)local_738);
  parsing::Preprocessor::~Preprocessor(&local_3c0);
  return pNVar1;
}

Assistant:

const NameSyntax& Compilation::tryParseName(std::string_view name, Diagnostics& localDiags) {
    SourceManager& sourceMan = SyntaxTree::getDefaultSourceManager();
    Preprocessor preprocessor(sourceMan, *this, localDiags);
    preprocessor.pushSource(name);

    Parser parser(preprocessor);
    return parser.parseName();
}